

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.h
# Opt level: O0

void Eigen::internal::queryCacheSizes_amd(int *l1,int *l2,int *l3)

{
  long lVar1;
  uint uVar2;
  int abcd [4];
  int *l3_local;
  int *l2_local;
  int *l1_local;
  
  lVar1 = cpuid(0x80000005);
  *l1 = (*(int *)(lVar1 + 0xc) >> 0x18) << 10;
  lVar1 = cpuid(0x80000006);
  uVar2 = *(uint *)(lVar1 + 8);
  *l2 = (*(int *)(lVar1 + 0xc) >> 0x10) << 10;
  *l3 = ((int)(uVar2 & 0xfffc000) >> 0x12) << 0x13;
  return;
}

Assistant:

inline void queryCacheSizes_amd(int& l1, int& l2, int& l3)
{
  int abcd[4];
  abcd[0] = abcd[1] = abcd[2] = abcd[3] = 0;
  EIGEN_CPUID(abcd,0x80000005,0);
  l1 = (abcd[2] >> 24) * 1024; // C[31:24] = L1 size in KB
  abcd[0] = abcd[1] = abcd[2] = abcd[3] = 0;
  EIGEN_CPUID(abcd,0x80000006,0);
  l2 = (abcd[2] >> 16) * 1024; // C[31;16] = l2 cache size in KB
  l3 = ((abcd[3] & 0xFFFC000) >> 18) * 512 * 1024; // D[31;18] = l3 cache size in 512KB
}